

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
toml::internal_error::internal_error(internal_error *this,string *what_arg,source_location *loc)

{
  exception::exception(&this->super_exception,loc);
  *(undefined ***)&this->super_exception = &PTR__internal_error_001f4f78;
  std::__cxx11::string::string((string *)&this->what_,(string *)what_arg);
  return;
}

Assistant:

explicit internal_error(const std::string& what_arg, const source_location& loc)
        : exception(loc), what_(what_arg)
    {}